

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::Pooling3DLayerParams::MergePartialFromCodedStream
          (Pooling3DLayerParams *this,CodedInputStream *input)

{
  byte bVar1;
  uint8 uVar2;
  byte *pbVar3;
  uint8 *puVar4;
  bool bVar5;
  uint32 uVar6;
  char cVar7;
  ulong uVar8;
  int iVar9;
  pair<unsigned_long,_bool> pVar10;
  
  do {
    pbVar3 = input->buffer_;
    uVar6 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar1 = *pbVar3;
      uVar6 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_00136e44;
      input->buffer_ = pbVar3 + 1;
      uVar8 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_00136e44:
      uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar8 = 0;
      if (uVar6 - 1 < 0x7f) {
        uVar8 = 0x100000000;
      }
      uVar8 = uVar6 | uVar8;
    }
    uVar6 = (uint32)uVar8;
    iVar9 = 6;
    if ((uVar8 & 0x100000000) == 0) goto switchD_00136e91_default;
    cVar7 = (char)uVar8;
    switch((uint)(uVar8 >> 3) & 0x1fffffff) {
    case 1:
      if (cVar7 != '\b') break;
      pbVar3 = input->buffer_;
      if (pbVar3 < input->buffer_end_) {
        bVar1 = *pbVar3;
        uVar8 = (ulong)bVar1;
        uVar6 = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_001372b0;
        input->buffer_ = pbVar3 + 1;
        bVar5 = true;
      }
      else {
        uVar6 = 0;
LAB_001372b0:
        uVar8 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
        bVar5 = -1 < (long)uVar8;
      }
      if (bVar5) {
        this->type_ = (int)uVar8;
        iVar9 = 0;
      }
LAB_001372da:
      if (bVar5) goto LAB_00136ecd;
      goto LAB_00136ecf;
    case 2:
      if (cVar7 == '\x10') {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar1 = *pbVar3;
          uVar8 = (ulong)bVar1;
          uVar6 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_001372e9;
          input->buffer_ = pbVar3 + 1;
          bVar5 = true;
        }
        else {
          uVar6 = 0;
LAB_001372e9:
          uVar8 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
          bVar5 = -1 < (long)uVar8;
        }
        if (bVar5) {
          this->kerneldepth_ = (int32)uVar8;
          goto LAB_00136ecd;
        }
        goto LAB_00136ecf;
      }
      break;
    case 3:
      if (cVar7 == '\x18') {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar1 = *pbVar3;
          uVar8 = (ulong)bVar1;
          uVar6 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_00137247;
          input->buffer_ = pbVar3 + 1;
          bVar5 = true;
        }
        else {
          uVar6 = 0;
LAB_00137247:
          uVar8 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
          bVar5 = -1 < (long)uVar8;
        }
        if (bVar5) {
          this->kernelheight_ = (int32)uVar8;
          goto LAB_00136ecd;
        }
        goto LAB_00136ecf;
      }
      break;
    case 4:
      if (cVar7 == ' ') {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar1 = *pbVar3;
          uVar8 = (ulong)bVar1;
          uVar6 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_0013726a;
          input->buffer_ = pbVar3 + 1;
          bVar5 = true;
        }
        else {
          uVar6 = 0;
LAB_0013726a:
          uVar8 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
          bVar5 = -1 < (long)uVar8;
        }
        if (bVar5) {
          this->kernelwidth_ = (int32)uVar8;
          goto LAB_00136ecd;
        }
        goto LAB_00136ecf;
      }
      break;
    case 5:
      if (cVar7 == '(') {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar1 = *pbVar3;
          uVar8 = (ulong)bVar1;
          uVar6 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_001371de;
          input->buffer_ = pbVar3 + 1;
          bVar5 = true;
        }
        else {
          uVar6 = 0;
LAB_001371de:
          uVar8 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
          bVar5 = -1 < (long)uVar8;
        }
        if (bVar5) {
          this->stridedepth_ = (int32)uVar8;
          goto LAB_00136ecd;
        }
        goto LAB_00136ecf;
      }
      break;
    case 6:
      if (cVar7 == '0') {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar1 = *pbVar3;
          uVar8 = (ulong)bVar1;
          uVar6 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_0013730c;
          input->buffer_ = pbVar3 + 1;
          bVar5 = true;
        }
        else {
          uVar6 = 0;
LAB_0013730c:
          uVar8 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
          bVar5 = -1 < (long)uVar8;
        }
        if (bVar5) {
          this->strideheight_ = (int32)uVar8;
          goto LAB_00136ecd;
        }
        goto LAB_00136ecf;
      }
      break;
    case 7:
      if (cVar7 == '8') {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar1 = *pbVar3;
          uVar8 = (ulong)bVar1;
          uVar6 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_0013732b;
          input->buffer_ = pbVar3 + 1;
          bVar5 = true;
        }
        else {
          uVar6 = 0;
LAB_0013732b:
          uVar8 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
          bVar5 = -1 < (long)uVar8;
        }
        if (bVar5) {
          this->stridewidth_ = (int32)uVar8;
          goto LAB_00136ecd;
        }
        goto LAB_00136ecf;
      }
      break;
    case 8:
      if (cVar7 == '@') {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar1 = *pbVar3;
          uVar8 = (ulong)bVar1;
          uVar6 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_0013728d;
          input->buffer_ = pbVar3 + 1;
          bVar5 = true;
        }
        else {
          uVar6 = 0;
LAB_0013728d:
          uVar8 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
          bVar5 = -1 < (long)uVar8;
        }
        if (bVar5) {
          this->custompaddingfront_ = (int32)uVar8;
          goto LAB_00136ecd;
        }
        goto LAB_00136ecf;
      }
      break;
    case 9:
      if (cVar7 == 'H') {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar1 = *pbVar3;
          uVar8 = (ulong)bVar1;
          uVar6 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_00137369;
          input->buffer_ = pbVar3 + 1;
          bVar5 = true;
        }
        else {
          uVar6 = 0;
LAB_00137369:
          uVar8 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
          bVar5 = -1 < (long)uVar8;
        }
        if (bVar5) {
          this->custompaddingback_ = (int32)uVar8;
          goto LAB_00136ecd;
        }
        goto LAB_00136ecf;
      }
      break;
    case 10:
      if (cVar7 == 'P') {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar1 = *pbVar3;
          uVar8 = (ulong)bVar1;
          uVar6 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_00137224;
          input->buffer_ = pbVar3 + 1;
          bVar5 = true;
        }
        else {
          uVar6 = 0;
LAB_00137224:
          uVar8 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
          bVar5 = -1 < (long)uVar8;
        }
        if (bVar5) {
          this->custompaddingtop_ = (int32)uVar8;
          goto LAB_00136ecd;
        }
        goto LAB_00136ecf;
      }
      break;
    case 0xb:
      if (cVar7 == 'X') {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar1 = *pbVar3;
          uVar8 = (ulong)bVar1;
          uVar6 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_0013734a;
          input->buffer_ = pbVar3 + 1;
          bVar5 = true;
        }
        else {
          uVar6 = 0;
LAB_0013734a:
          uVar8 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
          bVar5 = -1 < (long)uVar8;
        }
        if (bVar5) {
          this->custompaddingbottom_ = (int32)uVar8;
          goto LAB_00136ecd;
        }
        goto LAB_00136ecf;
      }
      break;
    case 0xc:
      if (cVar7 == '`') {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar1 = *pbVar3;
          uVar8 = (ulong)bVar1;
          uVar6 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_001371bb;
          input->buffer_ = pbVar3 + 1;
          bVar5 = true;
        }
        else {
          uVar6 = 0;
LAB_001371bb:
          uVar8 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
          bVar5 = -1 < (long)uVar8;
        }
        if (bVar5) {
          this->custompaddingleft_ = (int32)uVar8;
          goto LAB_00136ecd;
        }
        goto LAB_00136ecf;
      }
      break;
    case 0xd:
      if (cVar7 != 'h') break;
      pbVar3 = input->buffer_;
      if (pbVar3 < input->buffer_end_) {
        bVar1 = *pbVar3;
        uVar8 = (ulong)bVar1;
        uVar6 = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_00137201;
        input->buffer_ = pbVar3 + 1;
        bVar5 = true;
      }
      else {
        uVar6 = 0;
LAB_00137201:
        uVar8 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
        bVar5 = -1 < (long)uVar8;
      }
      if (!bVar5) goto LAB_00136ecf;
      this->custompaddingright_ = (int32)uVar8;
      goto LAB_00136ecd;
    case 0xe:
      if (cVar7 == 'p') {
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (uVar2 = *puVar4, -1 < (long)(char)uVar2)) {
          input->buffer_ = puVar4 + 1;
          pVar10._8_8_ = 1;
          pVar10.first = (long)(char)uVar2;
        }
        else {
          pVar10 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        }
        if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          this->countexcludepadding_ = pVar10.first != 0;
          goto LAB_00136ecd;
        }
        goto LAB_00136ecf;
      }
      break;
    case 0xf:
      if (cVar7 == 'x') {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar1 = *pbVar3;
          uVar8 = (ulong)bVar1;
          uVar6 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_0013718c;
          input->buffer_ = pbVar3 + 1;
          bVar5 = true;
        }
        else {
          uVar6 = 0;
LAB_0013718c:
          uVar8 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
          bVar5 = -1 < (long)uVar8;
        }
        if (bVar5) {
          this->paddingtype_ = (int)uVar8;
          iVar9 = 0;
        }
        goto LAB_001372da;
      }
    }
switchD_00136e91_default:
    if ((uVar6 & 7) == 4 || uVar6 == 0) {
      iVar9 = 7;
    }
    else {
      bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar6);
      if (bVar5) {
LAB_00136ecd:
        iVar9 = 0;
      }
    }
LAB_00136ecf:
    if (iVar9 != 0) {
      return iVar9 != 6;
    }
  } while( true );
}

Assistant:

bool Pooling3DLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.Pooling3DLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.Pooling3DLayerParams.PoolingType3D type = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_type(static_cast< ::CoreML::Specification::Pooling3DLayerParams_PoolingType3D >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 kernelDepth = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &kerneldepth_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 kernelHeight = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &kernelheight_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 kernelWidth = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(32u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &kernelwidth_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 strideDepth = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(40u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &stridedepth_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 strideHeight = 6;
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(48u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &strideheight_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 strideWidth = 7;
      case 7: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(56u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &stridewidth_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 customPaddingFront = 8;
      case 8: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(64u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &custompaddingfront_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 customPaddingBack = 9;
      case 9: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(72u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &custompaddingback_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 customPaddingTop = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(80u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &custompaddingtop_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 customPaddingBottom = 11;
      case 11: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(88u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &custompaddingbottom_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 customPaddingLeft = 12;
      case 12: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(96u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &custompaddingleft_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 customPaddingRight = 13;
      case 13: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(104u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &custompaddingright_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool countExcludePadding = 14;
      case 14: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(112u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &countexcludepadding_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Pooling3DLayerParams.Pooling3DPaddingType paddingType = 15;
      case 15: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(120u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_paddingtype(static_cast< ::CoreML::Specification::Pooling3DLayerParams_Pooling3DPaddingType >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.Pooling3DLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.Pooling3DLayerParams)
  return false;
#undef DO_
}